

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar_00;
  ImU32 tab_id_00;
  bool bVar1;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  char *label_local;
  
  bVar1 = false;
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    bVar1 = (GImGui->CurrentTabBar->Flags & 0x100000U) == 0;
  }
  if (bVar1) {
    tab_bar_00 = GImGui->CurrentTabBar;
    if ((tab_bar_00->WantLayout & 1U) == 0) {
      __assert_fail("tab_bar->WantLayout",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                    ,0x1aff,"void ImGui::SetTabItemClosed(const char *)");
    }
    tab_id_00 = TabBarCalcTabID(tab_bar_00,label);
    TabBarRemoveTab(tab_bar_00,tab_id_00);
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
}